

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void __thiscall
Assimp::glTF2Exporter::GetTexSampler
          (glTF2Exporter *this,aiMaterial *mat,Ref<glTF2::Texture> texture,aiTextureType tt,
          uint slot)

{
  Texture *pTVar1;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *pvVar2;
  aiMaterial *pMat;
  aiReturn aVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Ref<glTF2::Sampler> RVar7;
  SamplerMinFilter filterMin;
  SamplerMagFilter filterMag;
  aiTextureMapMode mapV;
  aiTextureMapMode mapU;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *local_868;
  aiMaterial *local_860;
  string id;
  aiString name;
  aiString aId;
  
  uVar4 = texture.index;
  aId.length = 0;
  aId.data[0] = '\0';
  memset(aId.data + 1,0x1b,0x3ff);
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  id.field_2._M_local_buf[0] = '\0';
  local_860 = mat;
  aVar3 = aiGetMaterialString(mat,"$tex.mappingid",tt,slot,&aId);
  if (aVar3 == aiReturn_SUCCESS) {
    std::__cxx11::string::assign((char *)&id);
  }
  RVar7 = glTF2::LazyDict<glTF2::Sampler>::Get
                    (&((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->samplers,id._M_dataplus._M_p);
  if (RVar7.vector == (vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *)0x0) {
    local_868 = texture.vector;
    glTF2::Asset::FindUniqueID
              ((string *)&name,
               (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &id,"sampler");
    std::__cxx11::string::operator=((string *)&id,(string *)&name);
    std::__cxx11::string::~string((string *)&name);
    RVar7 = glTF2::LazyDict<glTF2::Sampler>::Create
                      (&((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->samplers,id._M_dataplus._M_p);
    pMat = local_860;
    pvVar2 = local_868;
    pTVar1 = (local_868->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar4];
    (pTVar1->sampler).vector = RVar7.vector;
    (pTVar1->sampler).index = RVar7.index;
    aVar3 = aiGetMaterialInteger(local_860,"$tex.mapmodeu",tt,slot,(int *)&mapU);
    if (aVar3 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar2->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar4];
      uVar6 = 0x2901;
      if (mapU == aiTextureMapMode_Mirror) {
        uVar6 = 0x8370;
      }
      uVar5 = 0x812f;
      if (mapU != aiTextureMapMode_Clamp) {
        uVar5 = uVar6;
      }
      *(undefined4 *)
       (*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                            super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>)
                            ._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x58) = uVar5;
    }
    aVar3 = aiGetMaterialInteger(pMat,"$tex.mapmodev",tt,slot,(int *)&mapV);
    if (aVar3 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar2->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar4];
      uVar6 = 0x2901;
      if (mapV == aiTextureMapMode_Mirror) {
        uVar6 = 0x8370;
      }
      uVar5 = 0x812f;
      if (mapV != aiTextureMapMode_Clamp) {
        uVar5 = uVar6;
      }
      *(undefined4 *)
       (*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                            super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>)
                            ._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x5c) = uVar5;
    }
    aVar3 = aiGetMaterialInteger(pMat,"$tex.mappingfiltermag",tt,slot,(int *)&filterMag);
    if (aVar3 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar2->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar4];
      *(SamplerMagFilter *)
       (*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                            super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>)
                            ._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x50) = filterMag;
    }
    aVar3 = aiGetMaterialInteger(pMat,"$tex.mappingfiltermin",tt,slot,(int *)&filterMin);
    if (aVar3 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar2->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar4];
      *(SamplerMinFilter *)
       (*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                            super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>)
                            ._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x54) = filterMin;
    }
    name.length = 0;
    name.data[0] = '\0';
    memset(name.data + 1,0x1b,0x3ff);
    aVar3 = aiGetMaterialString(pMat,"$tex.mappingname",tt,slot,&name);
    if (aVar3 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar2->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar4];
      std::__cxx11::string::assign
                ((char *)(*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                                              super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                              )._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x30
                         ));
    }
  }
  else {
    pTVar1 = ((texture.vector)->
             super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    (pTVar1->sampler).vector = RVar7.vector;
    (pTVar1->sampler).index = RVar7.index;
  }
  std::__cxx11::string::~string((string *)&id);
  return;
}

Assistant:

void glTF2Exporter::GetTexSampler(const aiMaterial* mat, Ref<Texture> texture, aiTextureType tt, unsigned int slot)
{
    aiString aId;
    std::string id;
    if (aiGetMaterialString(mat, AI_MATKEY_GLTF_MAPPINGID(tt, slot), &aId) == AI_SUCCESS) {
        id = aId.C_Str();
    }

    if (Ref<Sampler> ref = mAsset->samplers.Get(id.c_str())) {
        texture->sampler = ref;
    } else {
        id = mAsset->FindUniqueID(id, "sampler");

        texture->sampler = mAsset->samplers.Create(id.c_str());

        aiTextureMapMode mapU, mapV;
        SamplerMagFilter filterMag;
        SamplerMinFilter filterMin;

        if (aiGetMaterialInteger(mat, AI_MATKEY_MAPPINGMODE_U(tt, slot), (int*)&mapU) == AI_SUCCESS) {
            SetSamplerWrap(texture->sampler->wrapS, mapU);
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_MAPPINGMODE_V(tt, slot), (int*)&mapV) == AI_SUCCESS) {
            SetSamplerWrap(texture->sampler->wrapT, mapV);
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_GLTF_MAPPINGFILTER_MAG(tt, slot), (int*)&filterMag) == AI_SUCCESS) {
            texture->sampler->magFilter = filterMag;
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_GLTF_MAPPINGFILTER_MIN(tt, slot), (int*)&filterMin) == AI_SUCCESS) {
            texture->sampler->minFilter = filterMin;
        }

        aiString name;
        if (aiGetMaterialString(mat, AI_MATKEY_GLTF_MAPPINGNAME(tt, slot), &name) == AI_SUCCESS) {
            texture->sampler->name = name.C_Str();
        }
    }
}